

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O3

optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> * __thiscall
ear::StereoPannerDownmix::handle
          (optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__return_storage_ptr__,
          StereoPannerDownmix *this,Vector3d *position)

{
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  undefined1 auVar1 [16];
  double dVar2;
  Index size;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar3;
  long lVar4;
  char *__function;
  ulong uVar5;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *poVar6;
  ulong uVar7;
  Index index_1;
  Scalar SVar8;
  double dVar9;
  undefined1 auVar10 [16];
  VectorXd _pv;
  MatrixXd downmix;
  undefined1 local_120 [24];
  long local_108;
  Scalar local_100;
  Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> local_f8;
  optional<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_c0;
  undefined1 local_b8 [16];
  long local_a8;
  Scalar local_a0;
  DenseStorage<double,__1,__1,_1,_0> local_98;
  double local_88;
  redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> local_80;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_b8 = (undefined1  [16])0x0;
  local_a8 = 0;
  local_c0 = __return_storage_ptr__;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_b8,10,2,5);
  local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
  m_value = 0;
  local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>._16_8_ = 1;
  local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
       (XprTypeNested)0x1;
  local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
       (PointerType)local_b8;
  if (((long)local_b8._8_8_ < 1) || (local_a8 < 1)) {
    __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x25,
                  "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  *(double *)local_b8._0_8_ = 1.0;
  local_80.super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>.
  super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  .m_data = (PointerType)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_f8,
                      (Scalar *)&local_80);
  local_a0 = 0.5773502691896257;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_a0);
  local_120._16_8_ = (DenseStorage<double,__1,__1,__1,_0> *)0x3fe6a09e667f3bcd;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)(local_120 + 0x10));
  local_120._0_8_ = (double *)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,(Scalar *)local_120);
  local_100 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_100);
  local_50 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_50);
  local_58 = 0.5773502691896257;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_58);
  local_60 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar3,&local_60);
  local_68 = 0.7071067811865476;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar3,&local_68);
  lVar4 = *(Index *)((long)local_f8.
                           super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                           .
                           super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                           .
                           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                           .m_data + 0x10);
  if ((long)&(local_f8.
              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
             m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> +
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
      m_value !=
      *(Index *)((long)local_f8.
                       super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                       .m_data + 8)) {
    if (lVar4 != 0) goto LAB_0013ffc0;
    lVar4 = 0;
  }
  if (local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>._16_8_ !=
      lVar4) {
LAB_0013ffc0:
    __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                  ,0x7c,
                  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  local_38 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
  local_48 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[0];
  dStack_40 = (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
  (**((this->_psp).super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
     _vptr_PointSourcePanner)(&local_a0);
  if (local_a0._0_1_ == 1) {
    this_00 = (DenseStorage<double,__1,__1,_1,_0> *)(local_120 + 0x10);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(this_00,&local_98);
    if (local_a8 != local_108) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Product.h"
                    ,0x62,
                    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
         (PointerType)local_b8;
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = (long)this_00;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_120,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_f8);
    local_80.super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>.
    super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
    .m_data = (PointerType)local_120;
    if (local_120._8_8_ != 0) {
      if ((long)local_120._8_8_ < 1) {
        __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Redux.h"
                      ,0x19b,
                      "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>, const Eigen::Matrix<double, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                     );
      }
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
      m_value = local_120._0_8_;
      auVar10._0_8_ =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                       *)&local_f8,(scalar_sum_op<double,_double> *)&local_100,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       *)&local_80);
      if ((long)local_120._8_8_ < 0) {
        __function = 
        "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
        ;
        goto LAB_00140087;
      }
      auVar10._8_8_ = 0;
      auVar10 = sqrtpd(auVar10,auVar10);
      uVar5 = local_120._8_8_ & 0x7ffffffffffffffe;
      dVar9 = auVar10._0_8_;
      if (1 < (ulong)local_120._8_8_) {
        uVar7 = 0;
        do {
          auVar1._8_8_ = dVar9;
          auVar1._0_8_ = dVar9;
          auVar10 = divpd(*(undefined1 (*) [16])(local_120._0_8_ + uVar7 * 8),auVar1);
          *(undefined1 (*) [16])(local_120._0_8_ + uVar7 * 8) = auVar10;
          uVar7 = uVar7 + 2;
        } while (uVar7 < uVar5);
      }
      if ((long)uVar5 < (long)local_120._8_8_) {
        do {
          *(double *)(local_120._0_8_ + uVar5 * 8) =
               *(double *)(local_120._0_8_ + uVar5 * 8) / dVar9;
          uVar5 = uVar5 + 1;
        } while (local_120._8_8_ != uVar5);
      }
    }
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
         (PointerType)local_120._16_8_;
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
    m_value = 3;
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_startRow.
    m_value = 0;
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_outerStride
         = local_108;
    if (2 < local_108) {
      local_80.super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_data = (PointerType)local_120._16_8_;
      local_80.super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>.
      super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
      .m_outerStride.m_value = local_108;
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
           (XprTypeNested)this_00;
      local_88 = Eigen::internal::
                 redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>,3,0>
                 ::run<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                           (&local_80,(scalar_max_op<double,_double,_0> *)&local_100,&local_f8);
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_startRow.
      m_value = local_108 + -2;
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_data =
           (PointerType)(local_108 * 8 + -0x10 + local_120._16_8_);
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.m_rows.
      m_value = 2;
      local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
      m_outerStride = local_108;
      if (1 < local_108) {
        local_80.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_outerStride.m_value = local_108;
        local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
             (XprTypeNested)this_00;
        local_80.
        super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>.
        super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
        .m_data = local_f8.
                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                  .m_data;
        SVar8 = Eigen::internal::
                redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>,3,0>
                ::run<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                          (&local_80,(scalar_max_op<double,_double,_0> *)&local_100,&local_f8);
        poVar6 = local_c0;
        dVar9 = exp2((SVar8 * -0.5) / (local_88 + SVar8));
        if ((long)local_120._8_8_ < 0) {
          __function = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
          ;
LAB_00140087:
          __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CwiseNullaryOp.h"
                        ,0x4a,__function);
        }
        uVar5 = local_120._8_8_ & 0x7ffffffffffffffe;
        if (1 < (ulong)local_120._8_8_) {
          uVar7 = 0;
          do {
            dVar2 = ((double *)(local_120._0_8_ + uVar7 * 8))[1];
            *(double *)(local_120._0_8_ + uVar7 * 8) =
                 *(double *)(local_120._0_8_ + uVar7 * 8) * dVar9;
            ((double *)(local_120._0_8_ + uVar7 * 8))[1] = dVar2 * dVar9;
            uVar7 = uVar7 + 2;
          } while (uVar7 < uVar5);
        }
        if ((long)uVar5 < (long)local_120._8_8_) {
          do {
            *(double *)(local_120._0_8_ + uVar5 * 8) =
                 *(double *)(local_120._0_8_ + uVar5 * 8) * dVar9;
            uVar5 = uVar5 + 1;
          } while (local_120._8_8_ != uVar5);
        }
        *(undefined8 *)&(poVar6->super_type).m_storage.dummy_ = local_120._0_8_;
        *(undefined8 *)((long)&(poVar6->super_type).m_storage.dummy_ + 8) = local_120._8_8_;
        (poVar6->super_type).m_initialized = true;
        free((void *)local_120._16_8_);
        goto LAB_0013ff90;
      }
    }
    local_f8.super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.m_xpr =
         (XprTypeNested)this_00;
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/Block.h"
                  ,0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  (local_c0->super_type).m_initialized = false;
  poVar6 = local_c0;
LAB_0013ff90:
  if ((local_a0._0_1_ & 1) != 0) {
    free(local_98.m_data);
  }
  free((void *)local_b8._0_8_);
  return poVar6;
}

Assistant:

boost::optional<Eigen::VectorXd> StereoPannerDownmix::handle(
      Eigen::Vector3d position) const {
    Eigen::MatrixXd downmix(2, 5);
    downmix << 1.0, 0.0, std::sqrt(3.0) / 3.0, std::sqrt(0.5), 0.0,  //
        0.0, 1.0, std::sqrt(3.0) / 3.0, 0.0, std::sqrt(0.5);

    // pan with 0+5+0, downmix and power normalise
    boost::optional<Eigen::VectorXd> pv = _psp->handle(position);

    if (pv) {
      Eigen::VectorXd _pv = pv.get();
      Eigen::VectorXd pvDownmix = downmix * _pv;
      pvDownmix /= pvDownmix.norm();

      // vary the output level by the balance between the front and rear
      // loudspeakers; 0dB at the front to -3dB at the back
      double front = _pv.head(3).maxCoeff();
      double back = _pv.tail(2).maxCoeff();

      pvDownmix = pvDownmix * std::pow(0.5, (0.5 * back / (front + back)));
      return pvDownmix;
    }
    return boost::none;
  }